

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O2

Session * __thiscall FIX::Acceptor::getSession(Acceptor *this,string *msg,Responder *responder)

{
  Header *this_00;
  bool bVar1;
  BeginString *pBVar2;
  SenderCompID *pSVar3;
  TargetCompID *pTVar4;
  MsgType *pMVar5;
  iterator iVar6;
  _Rb_tree_header *p_Var7;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  SessionID sessionID;
  Message message;
  allocator<char> local_3a9;
  string local_3a8;
  FieldBase local_388;
  FieldBase local_330;
  SessionID local_2d8;
  Message local_188;
  
  Message::Message(&local_188);
  bVar1 = Message::setStringHeader(&local_188,msg);
  if (bVar1) {
    this_00 = &local_188.m_header;
    pBVar2 = FieldMap::getField<FIX::BeginString>(&this_00->super_FieldMap);
    pSVar3 = FieldMap::getField<FIX::SenderCompID>(&this_00->super_FieldMap);
    pTVar4 = FieldMap::getField<FIX::TargetCompID>(&this_00->super_FieldMap);
    pMVar5 = FieldMap::getField<FIX::MsgType>(&this_00->super_FieldMap);
    bVar1 = std::operator!=(&(pMVar5->super_StringField).super_FieldBase.m_string,"A");
    if (!bVar1) {
      SenderCompID::SenderCompID
                ((SenderCompID *)&local_330,&(pTVar4->super_StringField).super_FieldBase.m_string);
      TargetCompID::TargetCompID
                ((TargetCompID *)&local_388,&(pSVar3->super_StringField).super_FieldBase.m_string);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"",&local_3a9);
      SessionID::SessionID
                (&local_2d8,&(pBVar2->super_StringField).super_FieldBase.m_string,
                 &local_330.m_string,&local_388.m_string,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      iVar6 = std::
              _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
              ::find(&(this->m_sessions)._M_t,&local_2d8);
      p_Var7 = &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar6._M_node != p_Var7) {
        Session::setResponder((Session *)iVar6._M_node[0xb]._M_left,responder);
        responder = (Responder *)iVar6._M_node[0xb]._M_left;
      }
      SessionID::~SessionID(&local_2d8);
      FieldBase::~FieldBase(&local_388);
      FieldBase::~FieldBase(&local_330);
      if ((_Rb_tree_header *)iVar6._M_node != p_Var7) goto LAB_0016bdd1;
    }
  }
  responder = (Responder *)0x0;
LAB_0016bdd1:
  Message::~Message(&local_188);
  return (Session *)responder;
}

Assistant:

Session *Acceptor::getSession(const std::string &msg, Responder &responder) {
  Message message;
  if (!message.setStringHeader(msg)) {
    return 0;
  }

  try {
    auto const &beginString = message.getHeader().getField<BeginString>();
    auto const &clSenderCompID = message.getHeader().getField<SenderCompID>();
    auto const &clTargetCompID = message.getHeader().getField<TargetCompID>();
    auto const &msgType = message.getHeader().getField<MsgType>();
    if (msgType != MsgType_Logon) {
      return 0;
    }

    SenderCompID senderCompID(clTargetCompID);
    TargetCompID targetCompID(clSenderCompID);
    SessionID sessionID(beginString, senderCompID, targetCompID);

    Sessions::iterator i = m_sessions.find(sessionID);
    if (i != m_sessions.end()) {
      i->second->setResponder(&responder);
      return i->second;
    }
  } catch (FieldNotFound &) {}
  return 0;
}